

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iVar1;
  int iStart;
  Vdbe *p;
  byte bVar2;
  uint uVar3;
  int nBase_00;
  int iVar4;
  int iVar5;
  int iVar6;
  VdbeOp *pVVar7;
  KeyInfo *pKVar8;
  int local_ac;
  int local_88;
  int iCsr;
  KeyInfo *pKI;
  int nKey;
  VdbeOp *pOp;
  int addrJmp;
  int addrFirst;
  int regPrevKey;
  int iSkip;
  int iLimit;
  int op;
  int nOBSat;
  int regRecord;
  int regBase;
  int nBase;
  int nExpr;
  int bSeq;
  Vdbe *v;
  int nData_local;
  int regOrigData_local;
  int regData_local;
  Select *pSelect_local;
  SortCtx *pSort_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  uVar3 = (uint)((pSort->sortFlags & 1) == 0);
  iVar1 = pSort->pOrderBy->nExpr;
  nBase_00 = iVar1 + uVar3 + nData;
  op = 0;
  iStart = pSort->nOBSat;
  addrFirst = 0;
  if (nPrefixReg == 0) {
    nOBSat = pParse->nMem + 1;
    pParse->nMem = nBase_00 + pParse->nMem;
  }
  else {
    nOBSat = regData - nPrefixReg;
  }
  if (pSelect->iOffset == 0) {
    local_88 = pSelect->iLimit;
  }
  else {
    local_88 = pSelect->iOffset + 1;
  }
  iVar4 = sqlite3VdbeMakeLabel(pParse);
  pSort->labelDone = iVar4;
  bVar2 = 0;
  if (regOrigData != 0) {
    bVar2 = 4;
  }
  sqlite3ExprCodeExprList(pParse,pSort->pOrderBy,nOBSat,regOrigData,bVar2 | 1);
  if (uVar3 != 0) {
    sqlite3VdbeAddOp2(p,0x78,pSort->iECursor,nOBSat + iVar1);
  }
  if ((nPrefixReg == 0) && (0 < nData)) {
    sqlite3ExprCodeMove(pParse,regData,nOBSat + iVar1 + uVar3,nData);
  }
  if (0 < iStart) {
    op = makeSorterRecord(pParse,pSort,pSelect,nOBSat,nBase_00);
    iVar5 = pParse->nMem + 1;
    pParse->nMem = pSort->nOBSat + pParse->nMem;
    iVar4 = pSort->nOBSat;
    if (uVar3 == 0) {
      pOp._4_4_ = sqlite3VdbeAddOp1(p,0x73,pSort->iECursor);
    }
    else {
      pOp._4_4_ = sqlite3VdbeAddOp1(p,0x14,nOBSat + iVar1);
    }
    sqlite3VdbeAddOp3(p,0x57,iVar5,nOBSat,pSort->nOBSat);
    pVVar7 = sqlite3VdbeGetOp(p,pSort->addrSortIndex);
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pVVar7->p2 = (iVar1 - iVar4) + uVar3 + nData;
    pKVar8 = (pVVar7->p4).pKeyInfo;
    memset(pKVar8->aSortOrder,0,(ulong)pKVar8->nKeyField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar8,-9);
    pKVar8 = sqlite3KeyInfoFromExprList
                       (pParse,pSort->pOrderBy,iStart,
                        ((uint)pKVar8->nAllField - (uint)pKVar8->nKeyField) + -1);
    (pVVar7->p4).pKeyInfo = pKVar8;
    iVar4 = sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp3(p,0x10,iVar4 + 1,0,iVar4 + 1);
    iVar6 = sqlite3VdbeMakeLabel(pParse);
    pSort->labelBkOut = iVar6;
    iVar6 = pParse->nMem + 1;
    pParse->nMem = iVar6;
    pSort->regReturn = iVar6;
    sqlite3VdbeAddOp2(p,0xc,pSort->regReturn,pSort->labelBkOut);
    sqlite3VdbeAddOp1(p,0x8a,pSort->iECursor);
    if (local_88 != 0) {
      sqlite3VdbeAddOp2(p,0x14,local_88,pSort->labelDone);
    }
    sqlite3VdbeJumpHere(p,pOp._4_4_);
    sqlite3ExprCodeMove(pParse,nOBSat,iVar5,pSort->nOBSat);
    sqlite3VdbeJumpHere(p,iVar4);
  }
  if (local_88 != 0) {
    iVar4 = pSort->iECursor;
    iVar5 = sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp2(p,0x30,local_88,iVar5 + 4);
    sqlite3VdbeAddOp2(p,0x20,iVar4,0);
    addrFirst = sqlite3VdbeAddOp4Int(p,0x25,iVar4,0,nOBSat + iStart,iVar1 - iStart);
    sqlite3VdbeAddOp1(p,0x7b,iVar4);
  }
  if (op == 0) {
    op = makeSorterRecord(pParse,pSort,pSelect,nOBSat,nBase_00);
  }
  if ((pSort->sortFlags & 1) == 0) {
    iSkip = 0x84;
  }
  else {
    iSkip = 0x83;
  }
  sqlite3VdbeAddOp4Int(p,iSkip,pSort->iECursor,op,nOBSat + iStart,nBase_00 - iStart);
  if (addrFirst != 0) {
    if (pSort->labelOBLopt == 0) {
      local_ac = sqlite3VdbeCurrentAddr(p);
    }
    else {
      local_ac = pSort->labelOBLopt;
    }
    sqlite3VdbeChangeP2(p,addrFirst,local_ac);
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCE optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the 
  **       SortCtx.pDeferredRowLoad optimiation.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than 
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more 
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
}